

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run3L1Q.cpp
# Opt level: O1

int main(void)

{
  double *pdVar1;
  Scalar SVar2;
  pointer pMVar3;
  pointer pMVar4;
  time_t tVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar10;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar11;
  byte bVar12;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  estTrans;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ptPairs;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lCPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  plPairs;
  Matrix<double,_4,_4,_0,_4,_4> estT;
  Matrix<double,_4,_4,_0,_4,_4> transGT;
  Matrix<double,_3,_3,_0,_3,_3> R;
  time_t t;
  AngleAxis<double> axAng;
  scalar_sum_op<double,_double> local_611;
  double local_610;
  Matrix<double,__1,__1,_0,_4,_4> local_608;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_578;
  long local_560;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_558;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_538;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_518;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_4f8;
  Product<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_1>
  local_4d8;
  undefined1 local_468 [104];
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  Matrix<double,_4,_4,_0,_4,_4> local_3e8;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_368;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_350;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_338;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_320;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_308;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_2f0;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_2d8;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_2c0;
  pointer local_2a8;
  pointer pMStack_2a0;
  pointer local_298;
  double dStack_290;
  XprTypeNested local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double *local_268;
  time_t local_260;
  AngleAxis<double> local_258;
  Matrix<double,_4,_4,_0,_4,_4> local_238;
  Matrix<double,_4,_4,_0,_4,_4> local_1b8;
  Matrix<double,_4,_4,_0,_4,_4> local_138;
  Matrix<double,_4,_4,_0,_4,_4> local_b8;
  
  bVar12 = 0;
  tVar5 = time(&local_260);
  srand((uint)tVar5);
  local_538.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_538.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_518.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_518.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_518.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  getGTTransformations<double>(&local_3e8,false);
  pMVar10 = &local_3e8;
  pMVar11 = &local_b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_608,&local_b8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_558,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_608);
  pMVar10 = &local_3e8;
  pMVar11 = &local_138;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_608,&local_138);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_558,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_608);
  pMVar10 = &local_3e8;
  pMVar11 = &local_1b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_608,&local_1b8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_558,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_608);
  pMVar10 = &local_3e8;
  pMVar11 = &local_238;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  genPointPair<double>
            ((pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             &local_608,&local_238);
  std::
  vector<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::allocator<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
  ::emplace_back<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>
            ((vector<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::allocator<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
              *)&local_538,
             (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             &local_608);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GT transformation: ",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  poVar6 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_3e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  lVar8 = std::chrono::_V2::system_clock::now();
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_2c0,&local_538);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_2d8,&local_4f8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_2f0,&local_558);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_308,&local_518);
  solver3L1Q<double>(&local_578,&local_2c0,&local_2d8,&local_2f0,&local_308);
  if (local_308.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f0.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d8.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c0.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c0.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  if (local_578.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_578.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_560 = (lVar7 - lVar8) / 1000;
    local_610 = 1000.0;
    lVar8 = 0x70;
    uVar9 = 0;
    do {
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x70);
      local_468._0_8_ = *pdVar1;
      local_468._8_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x60);
      local_468._16_8_ = *pdVar1;
      local_468._24_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x50);
      local_468._32_8_ = *pdVar1;
      local_468._40_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x40);
      local_468._48_8_ = *pdVar1;
      local_468._56_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x30);
      local_468._64_8_ = *pdVar1;
      local_468._72_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x20);
      local_468._80_8_ = *pdVar1;
      local_468._88_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x10);
      local_468._96_8_ = *pdVar1;
      dStack_400 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8);
      local_3f8 = *pdVar1;
      dStack_3f0 = pdVar1[1];
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[1] = (double)(local_468 + 0x60);
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[2] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[3] = 4.94065645841247e-324;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[5] = 0.0;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[6] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[7] = 1.97626258336499e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[8] = (double)(local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xc);
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[9] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[10] = 4.94065645841247e-324;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xb] = (double)&local_3e8;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xc] = 0.0;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xd] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xe] = 1.97626258336499e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[4] = (double)local_468;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                      m_storage.m_data.array[1];
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                      m_storage.m_data.array[8];
      SVar2 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                        ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                          *)&local_4d8,&local_611,
                         (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                          *)&local_608);
      if (SQRT(SVar2) < local_610) {
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)(local_468 + 0x60);
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 4.94065645841247e-324;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 1.97626258336499e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[8] = (double)(local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array + 0xc);
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 4.94065645841247e-324;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = (double)&local_3e8;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 1.97626258336499e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)local_468;
        local_4d8.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[1];
        local_4d8.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[8];
        SVar2 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
                ::
                run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                          ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                            *)&local_4d8,&local_611,
                           (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                            *)&local_608);
        local_610 = SQRT(SVar2);
      }
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_rows = 3;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_cols = 3;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 3;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 3;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)&local_3e8;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 3;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 3;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)local_468;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)local_468;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)
           local_4d8.m_rhs.m_matrix.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_data;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,4,4>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>,1>,Eigen::internal::assign_op<double,double>>
                (&local_608,&local_4d8,(assign_op<double,_double> *)&local_611);
      if ((local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_rows
           != 3) ||
         (local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_cols
          != 3)) goto LAB_0013a7c5;
      local_2a8 = (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                           m_storage.m_data.array[0];
      pMStack_2a0 = (pointer)local_608.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                             m_storage.m_data.array[1];
      local_298 = (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                           m_storage.m_data.array[2];
      dStack_290 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[3];
      local_288 = (XprTypeNested)
                  local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[4];
      dStack_280 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[5];
      local_278 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[6];
      dStack_270 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[7];
      local_268 = (double *)
                  local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[8];
      Eigen::AngleAxis<double>::fromRotationMatrix<Eigen::Matrix<double,3,3,0,3,3>>
                (&local_258,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error (frob norm): ",0x13);
      poVar6 = std::ostream::_M_insert<double>
                         (SQRT((local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] - dStack_3f0) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] - dStack_3f0) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xd] - dStack_400) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xd] - dStack_400) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] - (double)local_468._88_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] - (double)local_468._88_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[9] - (double)local_468._72_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[9] - (double)local_468._72_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] - (double)local_468._56_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] - (double)local_468._56_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] - (double)local_468._40_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] - (double)local_468._40_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[3] - (double)local_468._24_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[3] - (double)local_468._24_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[1] - (double)local_468._8_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[1] - (double)local_468._8_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] - local_3f8) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] - local_3f8) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xc] - (double)local_468._96_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xc] - (double)local_468._96_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] - (double)local_468._80_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] - (double)local_468._80_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[8] - (double)local_468._64_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[8] - (double)local_468._64_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] - (double)local_468._48_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] - (double)local_468._48_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] - (double)local_468._32_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] - (double)local_468._32_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[2] - (double)local_468._16_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[2] - (double)local_468._16_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0] - (double)local_468._0_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0] - (double)local_468._0_8_)));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", time: ",8);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x80;
    } while (uVar9 < (ulong)((long)local_578.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_578.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"New version of the solver",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  lVar8 = std::chrono::_V2::system_clock::now();
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_320,&local_538);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_338,&local_4f8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_350,&local_558);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_368,&local_518);
  solver3L1Q_New<double>
            ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&local_608,&local_320,&local_338,&local_350,&local_368);
  pMVar4 = local_578.
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pMVar3 = local_578.
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_578.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.
                m_data.array[0];
  local_578.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.
                m_data.array[1];
  local_578.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.
                m_data.array[2];
  local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  if (pMVar3 != (pointer)0x0) {
    operator_delete(pMVar3,(long)pMVar4 - (long)pMVar3);
  }
  if ((pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.
               m_data.array[0] != (pointer)0x0) {
    operator_delete((void *)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>
                            .m_storage.m_data.array[0],
                    (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                          m_storage.m_data.array[2] -
                    (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                          m_storage.m_data.array[0]);
  }
  if (local_368.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_350.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_350.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_320.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_320.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  if (local_578.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_578.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_560 = (lVar7 - lVar8) / 1000;
    local_610 = 1000.0;
    lVar8 = 0x70;
    uVar9 = 0;
    do {
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x70);
      local_468._0_8_ = *pdVar1;
      local_468._8_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x60);
      local_468._16_8_ = *pdVar1;
      local_468._24_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x50);
      local_468._32_8_ = *pdVar1;
      local_468._40_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x40);
      local_468._48_8_ = *pdVar1;
      local_468._56_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x30);
      local_468._64_8_ = *pdVar1;
      local_468._72_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x20);
      local_468._80_8_ = *pdVar1;
      local_468._88_8_ = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8 + -0x10);
      local_468._96_8_ = *pdVar1;
      dStack_400 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_578.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar8);
      local_3f8 = *pdVar1;
      dStack_3f0 = pdVar1[1];
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[1] = (double)(local_468 + 0x60);
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[2] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[3] = 4.94065645841247e-324;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[5] = 0.0;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[6] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[7] = 1.97626258336499e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[8] = (double)(local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xc);
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[9] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[10] = 4.94065645841247e-324;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xb] = (double)&local_3e8;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xc] = 0.0;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xd] = 1.48219693752374e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xe] = 1.97626258336499e-323;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[4] = (double)local_468;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                      m_storage.m_data.array[1];
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                      m_storage.m_data.array[8];
      SVar2 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                        ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                          *)&local_4d8,&local_611,
                         (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                          *)&local_608);
      if (SQRT(SVar2) < local_610) {
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)(local_468 + 0x60);
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 4.94065645841247e-324;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 1.97626258336499e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[8] = (double)(local_3e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array + 0xc);
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 4.94065645841247e-324;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = (double)&local_3e8;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 1.48219693752374e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 1.97626258336499e-323;
        local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)local_468;
        local_4d8.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[1];
        local_4d8.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = (long)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[8];
        SVar2 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
                ::
                run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                          ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                            *)&local_4d8,&local_611,
                           (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                            *)&local_608);
        local_610 = SQRT(SVar2);
      }
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_rows = 3;
      local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_cols = 3;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 3;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 3;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)&local_3e8;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 3;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 3;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)local_468;
      local_4d8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)local_468;
      local_4d8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)
           local_4d8.m_rhs.m_matrix.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_data;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,4,4>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>,1>,Eigen::internal::assign_op<double,double>>
                (&local_608,&local_4d8,(assign_op<double,_double> *)&local_611);
      if ((local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_rows
           != 3) ||
         (local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_cols
          != 3)) {
LAB_0013a7c5:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 3>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 3>]"
                     );
      }
      local_2a8 = (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                           m_storage.m_data.array[0];
      pMStack_2a0 = (pointer)local_608.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                             m_storage.m_data.array[1];
      local_298 = (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                           m_storage.m_data.array[2];
      dStack_290 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[3];
      local_288 = (XprTypeNested)
                  local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[4];
      dStack_280 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[5];
      local_278 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[6];
      dStack_270 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[7];
      local_268 = (double *)
                  local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[8];
      Eigen::AngleAxis<double>::fromRotationMatrix<Eigen::Matrix<double,3,3,0,3,3>>
                (&local_258,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error (frob norm): ",0x13);
      poVar6 = std::ostream::_M_insert<double>
                         (SQRT((local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] - dStack_3f0) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] - dStack_3f0) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xd] - dStack_400) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xd] - dStack_400) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] - (double)local_468._88_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] - (double)local_468._88_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[9] - (double)local_468._72_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[9] - (double)local_468._72_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] - (double)local_468._56_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] - (double)local_468._56_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] - (double)local_468._40_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] - (double)local_468._40_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[3] - (double)local_468._24_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[3] - (double)local_468._24_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[1] - (double)local_468._8_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[1] - (double)local_468._8_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] - local_3f8) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] - local_3f8) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xc] - (double)local_468._96_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xc] - (double)local_468._96_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] - (double)local_468._80_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] - (double)local_468._80_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[8] - (double)local_468._64_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[8] - (double)local_468._64_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] - (double)local_468._48_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] - (double)local_468._48_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] - (double)local_468._32_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] - (double)local_468._32_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[2] - (double)local_468._16_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[2] - (double)local_468._16_8_) +
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0] - (double)local_468._0_8_) *
                               (local_3e8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0] - (double)local_468._0_8_)));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", time: ",8);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x80;
    } while (uVar9 < (ulong)((long)local_578.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_578.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7));
  }
  if (local_578.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_578.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_578.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_578.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_518.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_558.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_558.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4f8.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4f8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4f8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_538.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_538.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_538.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_538.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(){
    bool verbose = true;
    high_resolution_clock::time_point t1, t2;

    // Intializes random number generator
    time_t t;
    srand((unsigned) time(&t));
    vector<double> timeVector;

    int powIter = 0;
	
    if (powIter > 1 && verbose)
	{
		std::cerr << "ERR: check the number of iterations and the verbose option..." << std::endl;
		//return 0;
	}

    vector<unsigned int> numSols;
    vector<double> transErrors;
    vector<double> rotErrors;
    std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> ptPairs;
	std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> plPairs;
	std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lPairs;
    std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lCPairs;
    for (int iter = 0 ; iter < pow(10,powIter) ; iter++){ 
	    
        Matrix<double, 4,4> transGT = getGTTransformations<double>();
        lPairs.push_back(genLineIntPair<double>(transGT));
        lPairs.push_back(genLineIntPair<double>(transGT));
        lPairs.push_back(genLineIntPair<double>(transGT));
        ptPairs.push_back(genPointPair<double>(transGT));

        if(verbose){
            cout << "GT transformation: " << endl;
            cout << transGT << endl;
        }

        // test solver
	    t1 = high_resolution_clock::now();
	    // run solver
        vector<Matrix<double, 4,4>> estTrans = solver3L1Q<double>(ptPairs,plPairs,lPairs,lCPairs);
	    t2 = high_resolution_clock::now();
	    auto duration = duration_cast<microseconds>( t2 - t1 ).count();

        Matrix<double, 4,4> estT;
        Matrix<double, 3,3> R;
        double transError = 1000;
        double rotError = 1000;
        AngleAxis<double> axAng;
        unsigned int numSols_count = 0;
        for(int iiter= 0; iiter < estTrans.size(); iiter++){
            estT = estTrans[iiter];
            //if(!isnan(estT(1,1))){
                numSols_count++;
                if( (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm() < transError)
                    transError = (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm();
                R = estT.topLeftCorner(3,3)*transGT.topLeftCorner(3,3).transpose();
                axAng.fromRotationMatrix(R);
                if( abs(axAng.angle()) < rotError)
                    rotError = abs(axAng.angle());
                // if (verbose) cout << "Estimated Transformation:" << endl << estT << endl;
                if (verbose) cout << "Error (frob norm): " << (transGT-estT).norm() << ", time: " << duration << endl;
            //}
        } 

        if(verbose) cout << "New version of the solver" << endl;

        // run new version of the solver       
	    t1 = high_resolution_clock::now();
	    // run solver
        estTrans = solver3L1Q_New<double>(ptPairs,plPairs,lPairs,lCPairs);
	    t2 = high_resolution_clock::now();
	    duration = duration_cast<microseconds>( t2 - t1 ).count();

        transError = 1000;
        rotError = 1000;
        numSols_count = 0;
        for(int iiter= 0; iiter < estTrans.size(); iiter++){
            estT = estTrans[iiter];
            //if(!isnan(estT(1,1))){
                numSols_count++;
                if( (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm() < transError)
                    transError = (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm();
                R = estT.topLeftCorner(3,3)*transGT.topLeftCorner(3,3).transpose();
                axAng.fromRotationMatrix(R);
                if( abs(axAng.angle()) < rotError)
                    rotError = abs(axAng.angle());
                // if (verbose) cout << "Estimated Transformation:" << endl << estT << endl;
                if (verbose) cout << "Error (frob norm): " << (transGT-estT).norm() << ", time: " << duration << endl;
            //}
        } 
    }

    return 0;
}